

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

void __thiscall Quat4f::normalize(Quat4f *this)

{
  float fVar1;
  
  fVar1 = this->m_elements[3] * this->m_elements[3] +
          this->m_elements[2] * this->m_elements[2] +
          this->m_elements[0] * this->m_elements[0] + this->m_elements[1] * this->m_elements[1];
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  this->m_elements[0] = this->m_elements[0] * fVar1;
  this->m_elements[1] = this->m_elements[1] * fVar1;
  this->m_elements[2] = this->m_elements[2] * fVar1;
  this->m_elements[3] = fVar1 * this->m_elements[3];
  return;
}

Assistant:

void Quat4f::normalize()
{
	float reciprocalAbs = 1.f / abs();

	m_elements[ 0 ] *= reciprocalAbs;
	m_elements[ 1 ] *= reciprocalAbs;
	m_elements[ 2 ] *= reciprocalAbs;
	m_elements[ 3 ] *= reciprocalAbs;
}